

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function_test.cpp
# Opt level: O1

void __thiscall
reflect_function_test_DefaultConstructor_Test::~reflect_function_test_DefaultConstructor_Test
          (reflect_function_test_DefaultConstructor_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(reflect_function_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	type char_type = type_create(TYPE_CHAR, "char", NULL, NULL);
	type int_type = type_create(TYPE_INT, "int", NULL, NULL);
	type ptr_type = type_create(TYPE_PTR, "ptr", NULL, NULL);

	EXPECT_NE((type)char_type, (type)NULL);
	EXPECT_NE((type)int_type, (type)NULL);
	EXPECT_NE((type)ptr_type, (type)NULL);

	if (char_type != NULL && int_type != NULL && ptr_type != NULL)
	{
		function f;

		function_impl_example example_impl = (function_impl_example)malloc(sizeof(struct function_impl_example_type));

		f = function_create("example", 3, example_impl, &function_example_singleton);

		EXPECT_NE((function)f, (function)NULL);

		if (f != NULL)
		{
			EXPECT_EQ((int)function_increment_reference(f), (int)0);

			signature_set(function_signature(f), 0, "c", char_type);
			signature_set(function_signature(f), 1, "i", int_type);
			signature_set(function_signature(f), 2, "p", ptr_type);

			/* function call example */
			{
				char c = 'm';
				int i = 123456789;
				struct example_arg_type e = { 5, 3.3f, "ABCDEFGHI" };

				function_args args = { &c, &i, &e };

				function_call(f, args, sizeof(args) / sizeof(args[0]));
			}

			function_destroy(f);
		}

		type_destroy(char_type);
		type_destroy(int_type);
		type_destroy(ptr_type);
	}
}